

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cc
# Opt level: O1

void __thiscall absl::lts_20240722::FlagSaver::~FlagSaver(FlagSaver *this)

{
  FlagSaverImpl *pFVar1;
  pointer puVar2;
  unique_ptr<absl::lts_20240722::flags_internal::FlagStateInterface,_std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>_>
  *flag_state;
  pointer puVar3;
  
  pFVar1 = this->impl_;
  if (pFVar1 != (FlagSaverImpl *)0x0) {
    puVar2 = (pFVar1->backup_registry_).
             super__Vector_base<std::unique_ptr<absl::lts_20240722::flags_internal::FlagStateInterface,_std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>_>,_std::allocator<std::unique_ptr<absl::lts_20240722::flags_internal::FlagStateInterface,_std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar3 = (pFVar1->backup_registry_).
                  super__Vector_base<std::unique_ptr<absl::lts_20240722::flags_internal::FlagStateInterface,_std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>_>,_std::allocator<std::unique_ptr<absl::lts_20240722::flags_internal::FlagStateInterface,_std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar2; puVar3 = puVar3 + 1)
    {
      (**(code **)(*(long *)(puVar3->_M_t).
                            super___uniq_ptr_impl<absl::lts_20240722::flags_internal::FlagStateInterface,_std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_absl::lts_20240722::flags_internal::FlagStateInterface_*,_std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>_>
                            .
                            super__Head_base<0UL,_absl::lts_20240722::flags_internal::FlagStateInterface_*,_false>
                            ._M_head_impl + 0x10))();
    }
    pFVar1 = this->impl_;
    if (pFVar1 != (FlagSaverImpl *)0x0) {
      std::
      vector<std::unique_ptr<absl::lts_20240722::flags_internal::FlagStateInterface,_std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>_>,_std::allocator<std::unique_ptr<absl::lts_20240722::flags_internal::FlagStateInterface,_std::default_delete<absl::lts_20240722::flags_internal::FlagStateInterface>_>_>_>
      ::~vector(&pFVar1->backup_registry_);
      operator_delete(pFVar1,0x18);
      return;
    }
  }
  return;
}

Assistant:

FlagSaver::~FlagSaver() {
  if (!impl_) return;

  impl_->RestoreToRegistry();
  delete impl_;
}